

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

void __thiscall ONX_Model::DumpSummary(ONX_Model *this,ON_TextLog *dump)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *s;
  ONX_ModelComponentList *pOVar4;
  ON_TextLog *dump_local;
  ONX_Model *this_local;
  
  ON_TextLog::Print(dump,"File version: %u\n",(ulong)(uint)this->m_3dm_file_version);
  bVar1 = ON_TextLog::IsTextHash(dump);
  if (!bVar1) {
    ON_TextLog::Print(dump,"File openNURBS version: %u\n",(ulong)this->m_3dm_opennurbs_version);
    if (this->m_3dm_file_byte_count != 0) {
      ON_TextLog::Print(dump,"File length: %llu bytes\n",this->m_3dm_file_byte_count);
    }
    iVar2 = ON_String::Length(&this->m_sStartSectionComments);
    if (0 < iVar2) {
      ON_TextLog::Print(dump,"Start section comments:\n");
      ON_TextLog::PushIndent(dump);
      s = ON_String::operator_cast_to_char_(&this->m_sStartSectionComments);
      ON_TextLog::PrintWrappedText(dump,s,0x3c);
      ON_TextLog::PopIndent(dump);
      ON_TextLog::Print(dump,"\n");
    }
    ON_3dmProperties::Dump(&this->m_properties,dump);
    ON_TextLog::Print(dump,"\n");
  }
  ON_3dmSettings::Dump(&this->m_settings,dump);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"Contents:\n");
  ON_TextLog::PushIndent(dump);
  pOVar4 = Internal_ComponentListConst(this,Image);
  ON_TextLog::Print(dump,"%u embedded images\n",(ulong)pOVar4->m_count);
  pOVar4 = Internal_ComponentListConst(this,Material);
  ON_TextLog::Print(dump,"%u materials\n",(ulong)pOVar4->m_count);
  pOVar4 = Internal_ComponentListConst(this,LinePattern);
  ON_TextLog::Print(dump,"%u line patterns\n",(ulong)pOVar4->m_count);
  pOVar4 = Internal_ComponentListConst(this,TextStyle);
  ON_TextLog::Print(dump,"%u text styles\n",(ulong)pOVar4->m_count);
  pOVar4 = Internal_ComponentListConst(this,DimStyle);
  ON_TextLog::Print(dump,"%u annotation styles\n",(ulong)pOVar4->m_count);
  pOVar4 = Internal_ComponentListConst(this,HatchPattern);
  ON_TextLog::Print(dump,"%u hatch patterns\n",(ulong)pOVar4->m_count);
  pOVar4 = Internal_ComponentListConst(this,Layer);
  ON_TextLog::Print(dump,"%u layers\n",(ulong)pOVar4->m_count);
  pOVar4 = Internal_ComponentListConst(this,Group);
  ON_TextLog::Print(dump,"%u groups\n",(ulong)pOVar4->m_count);
  pOVar4 = Internal_ComponentListConst(this,RenderLight);
  ON_TextLog::Print(dump,"%u lights\n",(ulong)pOVar4->m_count);
  pOVar4 = Internal_ComponentListConst(this,ModelGeometry);
  ON_TextLog::Print(dump,"%u model geometry objects\n",(ulong)pOVar4->m_count);
  bVar1 = ON_TextLog::IsTextHash(dump);
  if (!bVar1) {
    uVar3 = ON_SimpleArray<ONX_Model_UserData_*>::UnsignedCount(&this->m_userdata_table);
    ON_TextLog::Print(dump,"%u user data objects\n",(ulong)uVar3);
  }
  ON_TextLog::PopIndent(dump);
  return;
}

Assistant:

void ONX_Model::DumpSummary( ON_TextLog& dump ) const
{
  dump.Print("File version: %u\n",m_3dm_file_version);
  if (false == dump.IsTextHash())
  {
    dump.Print("File openNURBS version: %u\n", m_3dm_opennurbs_version);
    if (m_3dm_file_byte_count > 0)
      dump.Print("File length: %llu bytes\n", m_3dm_file_byte_count);

    if (m_sStartSectionComments.Length() > 0)
    {
      dump.Print("Start section comments:\n");
      dump.PushIndent();
      dump.PrintWrappedText(static_cast<const char*>(m_sStartSectionComments));
      dump.PopIndent();
      dump.Print("\n");
    }
  
    m_properties.Dump(dump);

    dump.Print("\n");
  }

  m_settings.Dump(dump);

  dump.Print("\n");

  dump.Print("Contents:\n");
  dump.PushIndent();
  dump.Print("%u embedded images\n",Internal_ComponentListConst(ON_ModelComponent::Type::Image).m_count);
  dump.Print("%u materials\n",Internal_ComponentListConst(ON_ModelComponent::Type::RenderMaterial).m_count);
  dump.Print("%u line patterns\n",Internal_ComponentListConst(ON_ModelComponent::Type::LinePattern).m_count);
  dump.Print("%u text styles\n",Internal_ComponentListConst(ON_ModelComponent::Type::TextStyle).m_count);
  dump.Print("%u annotation styles\n",Internal_ComponentListConst(ON_ModelComponent::Type::DimStyle).m_count);
  dump.Print("%u hatch patterns\n",Internal_ComponentListConst(ON_ModelComponent::Type::HatchPattern).m_count);
  dump.Print("%u layers\n",Internal_ComponentListConst(ON_ModelComponent::Type::Layer).m_count);
  dump.Print("%u groups\n",Internal_ComponentListConst(ON_ModelComponent::Type::Group).m_count);
  dump.Print("%u lights\n",Internal_ComponentListConst(ON_ModelComponent::Type::RenderLight).m_count);
  dump.Print("%u model geometry objects\n",Internal_ComponentListConst(ON_ModelComponent::Type::ModelGeometry).m_count);
  if (false == dump.IsTextHash())
  {
    dump.Print("%u user data objects\n", m_userdata_table.UnsignedCount());
  }
  dump.PopIndent();
}